

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O3

int event_deferred_cb_schedule_(event_base *base,event_callback *cb)

{
  int iVar1;
  
  if (base == (event_base *)0x0) {
    base = event_global_current_base_;
  }
  if (base->th_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.lock)(0,base->th_base_lock);
  }
  if (base->n_deferreds_queued < 0x21) {
    iVar1 = event_callback_activate_nolock_(base,cb);
    if (iVar1 == 0) {
      iVar1 = 0;
    }
    else {
      base->n_deferreds_queued = base->n_deferreds_queued + 1;
      iVar1 = 1;
    }
  }
  else {
    iVar1 = event_callback_activate_later_nolock_(base,cb);
  }
  if (base->th_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
  }
  return iVar1;
}

Assistant:

int
event_deferred_cb_schedule_(struct event_base *base, struct event_callback *cb)
{
	int r = 1;
	if (!base)
		base = current_base;
	EVBASE_ACQUIRE_LOCK(base, th_base_lock);
	if (base->n_deferreds_queued > MAX_DEFERREDS_QUEUED) {
		r = event_callback_activate_later_nolock_(base, cb);
	} else {
		r = event_callback_activate_nolock_(base, cb);
		if (r) {
			++base->n_deferreds_queued;
		}
	}
	EVBASE_RELEASE_LOCK(base, th_base_lock);
	return r;
}